

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

float quaternion_difference_EXP(quaternion *q1,quaternion *q2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = (q2->field_0).q[0] - (q1->field_0).q[0];
  fVar3 = (q2->field_0).q[1] - (q1->field_0).q[1];
  fVar4 = (q2->field_0).q[2] - (q1->field_0).q[2];
  fVar1 = (q2->field_0).q[3] - (q1->field_0).q[3];
  return fVar1 * fVar1 + fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3;
}

Assistant:

HYPAPI HYP_FLOAT quaternion_difference_EXP(const struct quaternion *q1, const struct quaternion *q2)
{
	struct quaternion diff;

	diff.x = q2->x - q1->x;
	diff.y = q2->y - q1->y;
	diff.z = q2->z - q1->z;
	diff.w = q2->w - q1->w;
	return quaternion_norm(&diff);
}